

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFModelExport.cpp
# Opt level: O2

bool iDynTree::exportLink(Link *link,string *linkName,Model *model,xmlNodePtr parent_element)

{
  bool bVar1;
  xmlNodePtr parent_element_00;
  SpatialInertia *inertia;
  long lVar2;
  long *plVar3;
  uint shapeIdx;
  uint uVar4;
  
  uVar4 = 0;
  parent_element_00 = (xmlNodePtr)xmlNewChild(parent_element,0,"link",0);
  xmlNewProp(parent_element_00,"name",(linkName->_M_dataplus)._M_p);
  inertia = (SpatialInertia *)iDynTree::Link::getInertia();
  bVar1 = exportInertial(inertia,parent_element_00);
  lVar2 = iDynTree::Model::getLinkIndex((string *)model);
  lVar2 = lVar2 * 0x18;
  while( true ) {
    iDynTree::Model::visualSolidShapes();
    plVar3 = (long *)iDynTree::ModelSolidShapes::getLinkSolidShapes();
    if ((ulong)(*(long *)(*plVar3 + 8 + lVar2) - *(long *)(*plVar3 + lVar2) >> 3) <= (ulong)uVar4)
    break;
    iDynTree::Model::visualSolidShapes();
    plVar3 = (long *)iDynTree::ModelSolidShapes::getLinkSolidShapes();
    exportSolidShape(*(SolidShape **)(*(long *)(*plVar3 + lVar2) + (ulong)uVar4 * 8),VISUAL,
                     parent_element_00);
    uVar4 = uVar4 + 1;
  }
  uVar4 = 0;
  while( true ) {
    iDynTree::Model::collisionSolidShapes();
    plVar3 = (long *)iDynTree::ModelSolidShapes::getLinkSolidShapes();
    if ((ulong)(*(long *)(*plVar3 + 8 + lVar2) - *(long *)(*plVar3 + lVar2) >> 3) <= (ulong)uVar4)
    break;
    iDynTree::Model::collisionSolidShapes();
    plVar3 = (long *)iDynTree::ModelSolidShapes::getLinkSolidShapes();
    exportSolidShape(*(SolidShape **)(*(long *)(*plVar3 + lVar2) + (ulong)uVar4 * 8),COLLISION,
                     parent_element_00);
    uVar4 = uVar4 + 1;
  }
  return bVar1;
}

Assistant:

bool exportLink(const Link &link, const std::string linkName, const Model& model, xmlNodePtr parent_element)
{
    bool ok = true;
    xmlNodePtr link_xml = xmlNewChild(parent_element, NULL, BAD_CAST "link", NULL);
    xmlNewProp(link_xml, BAD_CAST "name", BAD_CAST linkName.c_str());

    ok = ok && exportInertial(link.getInertia(), link_xml);

    LinkIndex linkIndex = model.getLinkIndex(linkName);

    // Export visual shapes
    for(unsigned int shapeIdx=0; shapeIdx < model.visualSolidShapes().getLinkSolidShapes()[linkIndex].size(); shapeIdx++) {
        SolidShape * exportedShape = model.visualSolidShapes().getLinkSolidShapes()[linkIndex][shapeIdx];
        exportSolidShape(exportedShape, VISUAL, link_xml);
    }

    // Export collision shapes
    for(unsigned int shapeIdx=0; shapeIdx < model.collisionSolidShapes().getLinkSolidShapes()[linkIndex].size(); shapeIdx++) {
        // Clone the shape
        SolidShape * exportedShape = model.collisionSolidShapes().getLinkSolidShapes()[linkIndex][shapeIdx];
        exportSolidShape(exportedShape, COLLISION, link_xml);
    }

    return ok;
}